

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

NULLCArray NULLC::IntToStr(int *r)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  NULLCArray NVar9;
  char buf [16];
  
  if (r == (int *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    NVar9 = (NULLCArray)ZEXT812(0);
  }
  else {
    iVar2 = *r;
    cVar4 = (char)((long)iVar2 % 10);
    cVar5 = -cVar4;
    if (0 < (int)((long)iVar2 % 10)) {
      cVar5 = cVar4;
    }
    buf[0] = cVar5 + '0';
    iVar6 = iVar2;
    pcVar7 = buf;
    while (pcVar8 = pcVar7 + 1, 0x12 < iVar6 + 9U) {
      lVar3 = (long)iVar6;
      iVar6 = (int)(lVar3 / 10);
      lVar3 = (long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | lVar3 / 10 & 0xffffffffU) % 10;
      cVar4 = (char)lVar3;
      cVar5 = -cVar4;
      if (0 < (int)lVar3) {
        cVar5 = cVar4;
      }
      *pcVar8 = cVar5 + '0';
      pcVar7 = pcVar8;
    }
    if (iVar2 < 0) {
      *pcVar8 = '-';
      pcVar8 = pcVar7 + 2;
    }
    NVar9 = AllocArray(1,((int)pcVar8 - (int)buf) + 1,2);
    pcVar7 = NVar9.ptr;
    do {
      pcVar1 = pcVar8 + -1;
      pcVar8 = pcVar8 + -1;
      *pcVar7 = *pcVar1;
      pcVar7 = pcVar7 + 1;
    } while (pcVar8 != buf);
  }
  return NVar9;
}

Assistant:

NULLCArray NULLC::IntToStr(int* r)
{
	NULLCArray arr = { 0, 0 };
	if(!r)
	{
		nullcThrowError("ERROR: null pointer access");
		return arr;
	}

	int number = *r;
	bool sign = 0;
	char buf[16];
	char *curr = buf;
	if(number < 0)
		sign = 1;

	*curr++ = (char)(abs(number % 10) + '0');
	while(number /= 10)
		*curr++ = (char)(abs(number % 10) + '0');
	if(sign)
		*curr++ = '-';
	arr = AllocArray(1, (int)(curr - buf) + 1, NULLC_TYPE_CHAR);
	char *str = arr.ptr;
	do 
	{
		--curr;
		*str++ = *curr;
	}while(curr != buf);
	return arr;
}